

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

optional<wasm::HeapType> __thiscall
wasm::TypeMapper::getDeclaredSuperType(TypeMapper *this,HeapType oldType)

{
  const_iterator cVar1;
  _Storage<wasm::HeapType,_true> *__k;
  undefined8 extraout_RDX;
  undefined7 uVar3;
  optional<wasm::HeapType> oVar4;
  HeapType local_28;
  HeapType oldType_local;
  optional<wasm::HeapType> super;
  undefined8 uVar2;
  
  local_28.id = oldType.id;
  oVar4 = HeapType::getDeclaredSuperType(&local_28);
  uVar2 = oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_;
  oldType_local.id =
       (uintptr_t)
       oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload._M_value;
  if (((undefined1  [16])
       oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    __k = (_Storage<wasm::HeapType,_true> *)&oldType_local;
  }
  else {
    __k = (_Storage<wasm::HeapType,_true> *)&oldType_local;
    cVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->mapping->_M_h,&__k->_M_value);
    uVar3 = (undefined7)((ulong)extraout_RDX >> 8);
    if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
        _M_cur == (__node_type *)0x0) {
      uVar2 = CONCAT71(uVar3,oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_engaged);
    }
    else {
      __k = (_Storage<wasm::HeapType,_true> *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
                   _M_cur + 0x10);
      uVar2 = CONCAT71(uVar3,1);
    }
  }
  oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = uVar2;
  oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = *__k;
  return (optional<wasm::HeapType>)
         oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> getDeclaredSuperType(HeapType oldType) override {
    // If the super is mapped, get it from the mapping.
    auto super = oldType.getDeclaredSuperType();
    if (super) {
      if (auto it = mapping.find(*super); it != mapping.end()) {
        return it->second;
      }
    }
    return super;
  }